

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

bool __thiscall tetgenio::load_medit(tetgenio *this,char *filebasename,int istetmesh)

{
  double dVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  uint uVar5;
  char *result;
  size_t sVar6;
  byte *pbVar7;
  ulong uVar8;
  byte *pbVar9;
  long lVar10;
  double *pdVar11;
  int *piVar12;
  facet *pfVar13;
  int *piVar14;
  tetgenio *ptVar15;
  long lVar16;
  facet *pfVar17;
  polygon *ppVar18;
  tetgenio *ptVar19;
  byte bVar20;
  tetgenio *in_RCX;
  uint uVar21;
  char *__format;
  FILE *__stream;
  uint uVar22;
  ulong uVar23;
  long lVar24;
  char *result_2;
  ulong uVar25;
  bool bVar26;
  char infilename [1024];
  char buffer [2048];
  byte *local_ca8;
  ulong local_ca0;
  tetgenio *local_c98;
  FILE *local_c90;
  ulong local_c88;
  long local_c80;
  int local_c74;
  ulong local_c70;
  long local_c68;
  ulong local_c60;
  long local_c58;
  long local_c50;
  ulong local_c48;
  undefined8 local_c40;
  char local_c38 [4];
  undefined2 auStack_c34 [509];
  undefined1 local_839;
  char local_838 [2056];
  
  strncpy(local_c38,filebasename,0x3ff);
  local_839 = 0;
  if (local_c38[0] == '\0') {
    puts("Error:  No filename.");
    bVar26 = false;
  }
  else {
    sVar6 = strlen(local_c38);
    iVar4 = strcmp(local_c38 + (sVar6 - 5),".mesh");
    if (iVar4 != 0) {
      sVar6 = strlen(local_c38);
      builtin_strncpy(local_c38 + sVar6,".mes",4);
      *(undefined2 *)((long)auStack_c34 + sVar6) = 0x68;
    }
    local_c90 = fopen(local_c38,"r");
    if (local_c90 == (FILE *)0x0) {
      bVar26 = false;
      printf("Error:  Unable to open file %s\n",local_c38);
    }
    else {
      local_c74 = istetmesh;
      printf("Opening %s.\n",local_c38);
      local_c40 = 0x3fffffff8;
      local_c68 = 0;
      local_c80 = 0;
      local_c58 = 0;
      uVar21 = 0;
      uVar22 = 0;
      local_c98 = this;
      uVar25 = 0;
      __stream = local_c90;
LAB_0010b751:
      local_c60 = uVar25;
      uVar5 = uVar22;
      pbVar7 = (byte *)fgets(local_838,0x7ff,__stream);
      if (pbVar7 != (byte *)0x0) {
        uVar22 = uVar5 + 1;
        for (; uVar8 = (ulong)*pbVar7, uVar8 < 0x24; pbVar7 = pbVar7 + 1) {
          if ((0x100000200U >> (uVar8 & 0x3f) & 1) == 0) {
            in_RCX = (tetgenio *)0x2401;
            uVar25 = local_c60;
            if (((0x2401UL >> (uVar8 & 0x3f) & 1) != 0) || (uVar8 == 0x23)) goto LAB_0010b751;
            break;
          }
        }
        bVar26 = (int)local_c68 == 0;
        local_ca8 = pbVar7;
        if (bVar26) {
          pbVar9 = (byte *)strstr((char *)pbVar7,"Dimension");
          if (((pbVar9 == (byte *)0x0) &&
              (pbVar9 = (byte *)strstr((char *)pbVar7,"dimension"), pbVar9 == (byte *)0x0)) &&
             (pbVar9 = (byte *)strstr((char *)pbVar7,"DIMENSION"), pbVar9 == (byte *)0x0)) {
            local_c68 = 0;
            goto LAB_0010b8db;
          }
          while ((uVar25 = (ulong)*pbVar9, 0x2c < uVar25 ||
                 ((0x100900000201U >> (uVar25 & 0x3f) & 1) == 0))) {
            pbVar9 = pbVar9 + 1;
          }
          while (bVar20 = (byte)uVar25, 0x2e < bVar20) {
LAB_0010b837:
            if (0xf5 < (byte)(bVar20 - 0x3a)) goto LAB_0010b8b5;
            pbVar7 = pbVar9 + 1;
            pbVar9 = pbVar9 + 1;
            uVar25 = (ulong)*pbVar7;
          }
          if ((0x680000000001U >> (uVar25 & 0x3f) & 1) == 0) {
            if (uVar25 != 0x23) goto LAB_0010b837;
            *pbVar9 = 0;
LAB_0010b852:
            pbVar9 = (byte *)fgets(local_838,0x7ff,__stream);
            uVar22 = uVar5 + 2;
            goto LAB_0010b86e;
          }
          local_ca8 = pbVar9;
          if (bVar20 == 0) goto LAB_0010b852;
          goto LAB_0010b8b5;
        }
        goto LAB_0010b8db;
      }
      fclose(__stream);
      if (uVar21 < 2) {
        local_c98->firstnumber = uVar21;
        bVar26 = true;
      }
      else {
        bVar26 = false;
        printf("A wrong smallest index (%d) was detected in file %s\n",(ulong)uVar21,local_c38);
      }
    }
  }
  return bVar26;
LAB_0010b86e:
  if (pbVar9 == (byte *)0x0) goto LAB_0010b8ac;
  while( true ) {
    uVar25 = (ulong)*pbVar9;
    if (0x20 < uVar25) goto LAB_0010b8b5;
    if ((0x100000200U >> (uVar25 & 0x3f) & 1) == 0) break;
    pbVar9 = pbVar9 + 1;
  }
  if ((0x2401UL >> (uVar25 & 0x3f) & 1) == 0) goto LAB_0010b8b5;
  pbVar9 = (byte *)fgets(local_838,0x7ff,__stream);
  uVar22 = uVar22 + 1;
  goto LAB_0010b86e;
LAB_0010b8ac:
  pbVar9 = (byte *)0x0;
LAB_0010b8b5:
  local_ca8 = pbVar9;
  lVar10 = strtol((char *)local_ca8,(char **)&local_ca8,0);
  if ((int)lVar10 - 4U < 0xfffffffe) {
    printf("Unknown dimension in file on line %d in file %s\n",(ulong)uVar22,local_c38);
    goto LAB_0010c5a0;
  }
  local_c98->mesh_dim = (int)lVar10;
  in_RCX = local_c98;
  local_c68 = lVar10;
LAB_0010b8db:
  ptVar19 = local_c98;
  pbVar7 = local_ca8;
  if (((int)local_c60 == 0) &&
     (((pbVar9 = (byte *)strstr((char *)local_ca8,"Vertices"), pbVar9 != (byte *)0x0 ||
       (pbVar9 = (byte *)strstr((char *)pbVar7,"vertices"), pbVar9 != (byte *)0x0)) ||
      (pbVar9 = (byte *)strstr((char *)pbVar7,"VERTICES"), pbVar9 != (byte *)0x0)))) {
    while ((in_RCX = (tetgenio *)(ulong)*pbVar9, (tetgenio *)0x2c < in_RCX ||
           ((0x100900000201U >> ((ulong)in_RCX & 0x3f) & 1) == 0))) {
      pbVar9 = pbVar9 + 1;
    }
    do {
      bVar20 = (byte)in_RCX;
      if (bVar20 < 0x2f) {
        if ((0x680000000001U >> ((ulong)in_RCX & 0x3f) & 1) != 0) {
          local_ca8 = pbVar9;
          if (bVar20 == 0) goto LAB_0010c332;
          goto LAB_0010c376;
        }
        if (in_RCX == (tetgenio *)0x23) {
          *pbVar9 = 0;
          goto LAB_0010c332;
        }
      }
      in_RCX = (tetgenio *)0x0;
      if (0xf5 < (byte)(bVar20 - 0x3a)) goto LAB_0010c376;
      in_RCX = (tetgenio *)(ulong)pbVar9[1];
      pbVar9 = pbVar9 + 1;
    } while( true );
  }
  pbVar7 = local_ca8;
  if ((int)local_c58 != 0) goto LAB_0010b94b;
  pbVar9 = (byte *)strstr((char *)local_ca8,"Tetrahedra");
  if (((pbVar9 != (byte *)0x0) ||
      (pbVar9 = (byte *)strstr((char *)pbVar7,"tetrahedra"), pbVar9 != (byte *)0x0)) ||
     (pbVar9 = (byte *)strstr((char *)pbVar7,"TETRAHEDRA"), pbVar9 != (byte *)0x0)) {
    while ((uVar25 = (ulong)*pbVar9, 0x2c < uVar25 ||
           ((0x100900000201U >> (uVar25 & 0x3f) & 1) == 0))) {
      pbVar9 = pbVar9 + 1;
    }
    do {
      bVar20 = (byte)uVar25;
      if (bVar20 < 0x2f) {
        if ((0x680000000001U >> (uVar25 & 0x3f) & 1) != 0) {
          local_ca8 = pbVar9;
          if (bVar20 == 0) goto LAB_0010bb05;
          goto LAB_0010bb4c;
        }
        if (uVar25 == 0x23) {
          *pbVar9 = 0;
          goto LAB_0010bb05;
        }
      }
      uVar25 = 0;
      if (0xf5 < (byte)(bVar20 - 0x3a)) goto LAB_0010bb4c;
      uVar25 = (ulong)pbVar9[1];
      pbVar9 = pbVar9 + 1;
    } while( true );
  }
  local_c70 = local_c70 & 0xffffffff00000000;
  iVar4 = 0;
  local_c58 = 0;
LAB_0010bbb4:
  __stream = local_c90;
  if (0 < ptVar19->numberoftetrahedra) {
    local_ca0 = CONCAT44(local_ca0._4_4_,uVar22);
    uVar25 = 0;
    do {
      __stream = local_c90;
      piVar12 = ptVar19->tetrahedronlist;
      local_c88 = uVar25;
      pbVar7 = (byte *)fgets(local_838,0x7ff,local_c90);
      uVar22 = (uint)local_ca0;
      while( true ) {
        uVar22 = uVar22 + 1;
        if (pbVar7 == (byte *)0x0) goto LAB_0010c585;
        while( true ) {
          uVar8 = (ulong)*pbVar7;
          if (0x20 < uVar8) goto LAB_0010bc40;
          if ((0x100000200U >> (uVar8 & 0x3f) & 1) == 0) break;
          pbVar7 = pbVar7 + 1;
        }
        if ((0x2401UL >> (uVar8 & 0x3f) & 1) == 0) break;
        pbVar7 = (byte *)fgets(local_838,0x7ff,__stream);
      }
LAB_0010bc40:
      local_ca0 = CONCAT44(local_ca0._4_4_,uVar22);
      if ((char)local_c70 != '\0') {
        uVar23 = 0;
        do {
          local_ca8 = pbVar7;
          if ((char)uVar8 == '\0') goto LAB_0010c54d;
          lVar10 = strtol((char *)pbVar7,(char **)&local_ca8,0);
          uVar22 = (uint)lVar10;
          piVar12[uVar25 * 4 + uVar23] = uVar22;
          pbVar7 = local_ca8;
          if ((int)uVar21 < (int)uVar22) {
            uVar22 = uVar21;
          }
          while ((uVar21 = uVar22, uVar8 = (ulong)*pbVar7, 0x2c < uVar8 ||
                 ((0x100900000201U >> (uVar8 & 0x3f) & 1) == 0))) {
            pbVar7 = pbVar7 + 1;
            uVar22 = uVar21;
          }
LAB_0010bcaf:
          if (0x2e < (byte)uVar8) {
LAB_0010bcc3:
            if (0xf5 < (byte)((byte)uVar8 - 0x3a)) goto LAB_0010bcd2;
            uVar8 = (ulong)pbVar7[1];
            pbVar7 = pbVar7 + 1;
            goto LAB_0010bcaf;
          }
          if ((0x680000000001U >> (uVar8 & 0x3f) & 1) != 0) goto LAB_0010bcd2;
          if (uVar8 != 0x23) goto LAB_0010bcc3;
          *pbVar7 = 0;
          uVar8 = 0;
LAB_0010bcd2:
          uVar23 = uVar23 + 1;
        } while (uVar23 != iVar4 + (uint)(iVar4 == 0));
      }
      uVar25 = local_c88;
      ptVar19 = local_c98;
      in_RCX = (tetgenio *)local_c98->tetrahedronattributelist;
      *(undefined8 *)(&in_RCX->firstnumber + local_c88 * 2) = 0;
      local_ca8 = pbVar7;
      if (*pbVar7 != 0) {
        lVar10 = strtol((char *)pbVar7,(char **)&local_ca8,0);
        ptVar19->tetrahedronattributelist[uVar25] = (double)lVar10;
      }
      uVar25 = uVar25 + 1;
    } while ((long)uVar25 < (long)ptVar19->numberoftetrahedra);
    __stream = local_c90;
    uVar22 = (uint)local_ca0;
  }
LAB_0010b94b:
  pbVar7 = local_ca8;
  uVar25 = local_c60;
  if ((int)local_c80 == 0) {
    pbVar9 = (byte *)strstr((char *)local_ca8,"Triangles");
    local_c88 = CONCAT44(local_c88._4_4_,(int)CONCAT71((int7)((ulong)in_RCX >> 8),1));
    local_c70 = 3;
    if (((pbVar9 == (byte *)0x0) &&
        (pbVar9 = (byte *)strstr((char *)pbVar7,"triangles"), pbVar9 == (byte *)0x0)) &&
       (pbVar9 = (byte *)strstr((char *)pbVar7,"TRIANGLES"), pbVar9 == (byte *)0x0)) {
      pbVar9 = (byte *)strstr((char *)pbVar7,"Quadrilaterals");
      in_RCX = (tetgenio *)0x0;
      local_c70 = 4;
      if ((pbVar9 == (byte *)0x0) &&
         (pbVar9 = (byte *)strstr((char *)pbVar7,"quadrilaterals"), pbVar9 == (byte *)0x0)) {
        local_c80 = 0;
        pbVar9 = (byte *)strstr((char *)pbVar7,"QUADRILATERALS");
        uVar25 = local_c60;
        if (pbVar9 == (byte *)0x0) goto LAB_0010b751;
      }
      local_c88 = local_c88 & 0xffffffff00000000;
    }
    while ((uVar25 = (ulong)*pbVar9, 0x2c < uVar25 ||
           ((0x100900000201U >> (uVar25 & 0x3f) & 1) == 0))) {
      pbVar9 = pbVar9 + 1;
    }
    do {
      if ((byte)uVar25 < 0x2f) {
        if ((0x680000000001U >> (uVar25 & 0x3f) & 1) != 0) goto LAB_0010ba53;
        if (uVar25 == 0x23) {
          *pbVar9 = 0;
          goto LAB_0010bd54;
        }
      }
      if (0xf5 < (byte)((byte)uVar25 - 0x3a)) goto LAB_0010ba53;
      uVar25 = (ulong)pbVar9[1];
      pbVar9 = pbVar9 + 1;
    } while( true );
  }
  goto LAB_0010b751;
LAB_0010c332:
  in_RCX = (tetgenio *)0x0;
  pbVar9 = (byte *)fgets(local_838,0x7ff,__stream);
  uVar22 = uVar22 + 1;
  if (pbVar9 != (byte *)0x0) {
    while( true ) {
      in_RCX = (tetgenio *)(ulong)*pbVar9;
      if ((tetgenio *)0x20 < in_RCX) goto LAB_0010c376;
      if ((0x100000200U >> ((ulong)in_RCX & 0x3f) & 1) == 0) break;
      pbVar9 = pbVar9 + 1;
    }
    if ((0x2401UL >> ((ulong)in_RCX & 0x3f) & 1) == 0) goto LAB_0010c376;
    goto LAB_0010c332;
  }
  pbVar9 = (byte *)0x0;
LAB_0010c376:
  local_ca8 = pbVar9;
  uVar25 = strtol((char *)pbVar9,(char **)&local_ca8,0);
  uVar5 = (uint)uVar25;
  uVar21 = uVar5 + 1;
  if (0 < (int)uVar5) {
    uVar8 = (ulong)uVar22;
    ptVar19->numberofpoints = uVar5;
    pdVar11 = (double *)operator_new__(uVar25 * 0x18 & 0x7fffffff8);
    ptVar19->pointlist = pdVar11;
    local_c60 = (ulong)(uVar5 & 0x7fffffff);
    local_ca0 = 0;
    do {
      pbVar9 = (byte *)fgets(local_838,0x7ff,__stream);
      uVar25 = local_ca0;
      uVar22 = (uint)uVar8;
      pbVar7 = local_ca8;
      while( true ) {
        local_ca8 = pbVar9;
        uVar22 = uVar22 + 1;
        uVar8 = (ulong)uVar22;
        if (local_ca8 == (byte *)0x0) {
          local_ca8 = pbVar7;
          printf("Unexpected end of file on line %d in file %s\n",uVar8,local_c38);
          goto LAB_0010c5a0;
        }
        while( true ) {
          uVar23 = (ulong)*local_ca8;
          if (0x20 < uVar23) goto LAB_0010c44c;
          if ((0x100000200U >> (uVar23 & 0x3f) & 1) == 0) break;
          local_ca8 = local_ca8 + 1;
        }
        if ((0x2401UL >> (uVar23 & 0x3f) & 1) == 0) break;
        local_ca8 = pbVar7;
        pbVar9 = (byte *)fgets(local_838,0x7ff,__stream);
        pbVar7 = local_ca8;
      }
LAB_0010c44c:
      pdVar11 = ptVar19->pointlist;
      lVar10 = 0;
      do {
        if (*local_ca8 == 0) {
          printf("Syntax error reading vertex coords on line");
          __format = " %d in file %s\n";
          goto LAB_0010c55f;
        }
        if ((lVar10 == 2) && ((int)local_c68 != 3)) {
          pdVar11[uVar25 * 3 + 2] = 0.0;
        }
        else {
          dVar1 = strtod((char *)local_ca8,(char **)&local_ca8);
          pdVar11[uVar25 * 3 + lVar10] = dVar1;
        }
        while ((uVar23 = (ulong)*local_ca8, 0x2c < uVar23 ||
               ((0x100900000201U >> (uVar23 & 0x3f) & 1) == 0))) {
          local_ca8 = local_ca8 + 1;
        }
LAB_0010c4c7:
        if (0x2e < (byte)uVar23) {
LAB_0010c4db:
          if (0xf5 < (byte)((byte)uVar23 - 0x3a)) goto LAB_0010c4e8;
          uVar23 = (ulong)local_ca8[1];
          local_ca8 = local_ca8 + 1;
          goto LAB_0010c4c7;
        }
        if ((0x680000000001U >> (uVar23 & 0x3f) & 1) != 0) goto LAB_0010c4e8;
        if (uVar23 != 0x23) goto LAB_0010c4db;
        *local_ca8 = 0;
LAB_0010c4e8:
        in_RCX = (tetgenio *)0x0;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 3);
      local_ca0 = uVar25 + 1;
      ptVar19 = local_c98;
      __stream = local_c90;
      uVar25 = 1;
    } while (local_ca0 != local_c60);
  }
  goto LAB_0010b751;
LAB_0010bb05:
  uVar25 = 0;
  pbVar9 = (byte *)fgets(local_838,0x7ff,__stream);
  uVar22 = uVar22 + 1;
  if (pbVar9 != (byte *)0x0) {
    while( true ) {
      uVar25 = (ulong)*pbVar9;
      if (0x20 < uVar25) goto LAB_0010bb4c;
      if ((0x100000200U >> (uVar25 & 0x3f) & 1) == 0) break;
      pbVar9 = pbVar9 + 1;
    }
    if ((0x2401UL >> (uVar25 & 0x3f) & 1) == 0) goto LAB_0010bb4c;
    goto LAB_0010bb05;
  }
  pbVar9 = (byte *)0x0;
LAB_0010bb4c:
  local_ca8 = pbVar9;
  lVar10 = strtol((char *)pbVar9,(char **)&local_ca8,0);
  iVar4 = 4;
  in_RCX = (tetgenio *)CONCAT71((int7)(uVar25 >> 8),1);
  local_c70 = CONCAT44(local_c70._4_4_,(int)in_RCX);
  uVar5 = (uint)lVar10;
  local_c58 = lVar10;
  if (0 < (int)uVar5) {
    ptVar19->numberoftetrahedra = uVar5;
    ptVar19->numberofcorners = 4;
    ptVar19->numberoftetrahedronattributes = 1;
    piVar12 = (int *)operator_new__((ulong)(uVar5 & 0x3fffffff) << 4);
    ptVar19->tetrahedronlist = piVar12;
    pdVar11 = (double *)operator_new__(lVar10 << 3 & local_c40);
    ptVar19->tetrahedronattributelist = pdVar11;
  }
  goto LAB_0010bbb4;
LAB_0010ba53:
  in_RCX = (tetgenio *)0x0;
  local_ca8 = pbVar9;
  if (*pbVar9 == 0) {
LAB_0010bd54:
    do {
      in_RCX = (tetgenio *)0x0;
      pbVar9 = (byte *)fgets(local_838,0x7ff,__stream);
      uVar22 = uVar22 + 1;
      if (pbVar9 == (byte *)0x0) {
        pbVar9 = (byte *)0x0;
        break;
      }
      while( true ) {
        in_RCX = (tetgenio *)(ulong)*pbVar9;
        if ((tetgenio *)0x20 < in_RCX) goto LAB_0010bd98;
        if ((0x100000200U >> ((ulong)in_RCX & 0x3f) & 1) == 0) break;
        pbVar9 = pbVar9 + 1;
      }
      if ((0x2401UL >> ((ulong)in_RCX & 0x3f) & 1) == 0) break;
    } while( true );
  }
LAB_0010bd98:
  local_ca8 = pbVar9;
  local_c80 = strtol((char *)pbVar9,(char **)&local_ca8,0);
  uVar5 = (uint)local_c80;
  if ((int)uVar5 < 1) {
    if (local_c74 == 0) {
      uVar25 = (ulong)(ptVar19->numberoffacets + uVar5);
      goto LAB_0010be32;
    }
LAB_0010bf11:
    bVar26 = 0 < ptVar19->numberoftrifaces;
LAB_0010bf1c:
    bVar20 = (byte)local_c88 & bVar26;
    in_RCX = (tetgenio *)(ulong)CONCAT31((int3)(local_c88 >> 8),bVar20);
    uVar25 = local_c60;
    if (bVar20 == 1) {
      lVar10 = 0;
      do {
        piVar12 = ptVar19->trifacelist;
        do {
          pbVar7 = (byte *)fgets(local_838,0x7ff,__stream);
          uVar22 = uVar22 + 1;
          if (pbVar7 == (byte *)0x0) goto LAB_0010c585;
          while( true ) {
            ptVar15 = (tetgenio *)(ulong)*pbVar7;
            if ((tetgenio *)0x20 < ptVar15) goto LAB_0010bf83;
            if ((0x100000200U >> ((ulong)ptVar15 & 0x3f) & 1) == 0) break;
            pbVar7 = pbVar7 + 1;
          }
        } while ((0x2401UL >> ((ulong)ptVar15 & 0x3f) & 1) != 0);
LAB_0010bf83:
        local_ca0 = CONCAT44(local_ca0._4_4_,uVar22);
        lVar24 = 0;
        do {
          local_ca8 = pbVar7;
          if ((char)ptVar15 == '\0') goto LAB_0010c54d;
          lVar16 = strtol((char *)pbVar7,(char **)&local_ca8,0);
          ptVar19 = local_c98;
          uVar22 = (uint)lVar16;
          piVar12[lVar10 * 3 + lVar24] = uVar22;
          pbVar7 = local_ca8;
          if ((int)uVar21 < (int)uVar22) {
            uVar22 = uVar21;
          }
          while ((uVar21 = uVar22, in_RCX = (tetgenio *)(ulong)*pbVar7, (tetgenio *)0x2c < in_RCX ||
                 ((0x100900000201U >> ((ulong)in_RCX & 0x3f) & 1) == 0))) {
            pbVar7 = pbVar7 + 1;
            uVar22 = uVar21;
          }
LAB_0010bfe4:
          ptVar15 = in_RCX;
          if (0x2e < (byte)in_RCX) {
LAB_0010bff7:
            uVar22 = (int)in_RCX - 0x3a;
            in_RCX = (tetgenio *)(ulong)uVar22;
            if (0xf5 < (byte)uVar22) goto LAB_0010c006;
            in_RCX = (tetgenio *)(ulong)pbVar7[1];
            pbVar7 = pbVar7 + 1;
            goto LAB_0010bfe4;
          }
          if ((0x680000000001U >> ((ulong)in_RCX & 0x3f) & 1) != 0) goto LAB_0010c006;
          if (in_RCX != (tetgenio *)0x23) goto LAB_0010bff7;
          *pbVar7 = 0;
          ptVar15 = (tetgenio *)0x0;
LAB_0010c006:
          lVar24 = lVar24 + 1;
        } while (lVar24 != 3);
        local_c98->trifacemarkerlist[lVar10] = 0;
        local_ca8 = pbVar7;
        if (*pbVar7 != 0) {
          lVar24 = strtol((char *)pbVar7,(char **)&local_ca8,0);
          in_RCX = (tetgenio *)ptVar19->trifacemarkerlist;
          (&in_RCX->firstnumber)[lVar10] = (int)lVar24;
        }
        lVar10 = lVar10 + 1;
        __stream = local_c90;
        uVar22 = (uint)local_ca0;
        uVar25 = local_c60;
      } while (lVar10 < ptVar19->numberoftrifaces);
    }
    goto LAB_0010b751;
  }
  if (local_c74 != 0) {
    uVar25 = local_c60;
    if ((char)local_c88 == '\0') goto LAB_0010b751;
    ptVar19->numberoftrifaces = uVar5;
    uVar25 = local_c80 * 4;
    piVar12 = (int *)operator_new__(local_c80 * 0xc & 0x3fffffffc);
    ptVar19->trifacelist = piVar12;
    piVar12 = (int *)operator_new__(uVar25 & 0x1fffffffc);
    ptVar19->trifacemarkerlist = piVar12;
    bVar26 = true;
    goto LAB_0010bf1c;
  }
  iVar4 = ptVar19->numberoffacets;
  local_ca0 = CONCAT44(local_ca0._4_4_,uVar22);
  if ((long)iVar4 < 1) {
    pfVar17 = (facet *)operator_new__((ulong)(uVar5 & 0x7fffffff) << 5);
    ptVar19 = local_c98;
    local_c98->facetlist = pfVar17;
    piVar12 = (int *)operator_new__((ulong)(uVar5 & 0x7fffffff) << 2);
    ptVar19->facetmarkerlist = piVar12;
  }
  else {
    pfVar13 = (facet *)operator_new__((ulong)(iVar4 + uVar5) << 5);
    piVar14 = (int *)operator_new__((ulong)(iVar4 + uVar5) << 2);
    pfVar17 = local_c98->facetlist;
    piVar12 = local_c98->facetmarkerlist;
    in_RCX = (tetgenio *)0x0;
    do {
      (&pfVar13->polygonlist)[(long)in_RCX] = (polygon *)0x0;
      (&pfVar13->numberofpolygons)[(long)in_RCX * 2] = 0;
      (&pfVar13->holelist)[(long)in_RCX] = (double *)0x0;
      (&pfVar13->numberofholes)[(long)in_RCX * 2] = 0;
      ppVar18 = (&pfVar17->polygonlist)[(long)in_RCX];
      uVar2 = (&pfVar17->polygonlist + (long)in_RCX)[1];
      uVar3 = (&pfVar17->holelist + (long)in_RCX)[1];
      (&pfVar13->holelist)[(long)in_RCX] = (&pfVar17->holelist)[(long)in_RCX];
      (&pfVar13->holelist + (long)in_RCX)[1] = (double *)uVar3;
      (&pfVar13->polygonlist)[(long)in_RCX] = ppVar18;
      (&pfVar13->polygonlist + (long)in_RCX)[1] = (polygon *)uVar2;
      *(undefined4 *)((long)piVar14 + (long)in_RCX) = *(undefined4 *)((long)piVar12 + (long)in_RCX);
      in_RCX = (tetgenio *)((long)in_RCX + 4);
    } while ((tetgenio *)((long)iVar4 * 4) != in_RCX);
    operator_delete__(pfVar17);
    ptVar19 = local_c98;
    if (local_c98->facetmarkerlist != (int *)0x0) {
      operator_delete__(local_c98->facetmarkerlist);
    }
    ptVar19->facetlist = pfVar13;
    ptVar19->facetmarkerlist = piVar14;
    __stream = local_c90;
    uVar22 = (uint)local_ca0;
    if (local_c74 != 0) goto LAB_0010bf11;
    iVar4 = ptVar19->numberoffacets;
    if ((int)local_c80 < 1) {
      uVar25 = (ulong)(uint)(iVar4 + (int)local_c80);
      ptVar19 = local_c98;
      goto LAB_0010be32;
    }
  }
  local_c48 = (ulong)(uint)((int)local_c70 * 4);
  lVar10 = (long)iVar4;
  local_c88 = local_c70 & 0xffffffff;
  do {
    pbVar7 = (byte *)fgets(local_838,0x7ff,__stream);
    ptVar19 = local_c98;
    local_ca0 = CONCAT44(local_ca0._4_4_,(uint)local_ca0 + 1);
    while( true ) {
      if (pbVar7 == (byte *)0x0) {
        printf("Unexpected end of file on line %d in file %s\n",local_ca0 & 0xffffffff,local_c38);
        goto LAB_0010c5a0;
      }
      while( true ) {
        uVar25 = (ulong)*pbVar7;
        if (0x20 < uVar25) goto LAB_0010c16f;
        if ((0x100000200U >> (uVar25 & 0x3f) & 1) == 0) break;
        pbVar7 = pbVar7 + 1;
      }
      if ((0x2401UL >> (uVar25 & 0x3f) & 1) == 0) break;
      pbVar7 = (byte *)fgets(local_838,0x7ff,__stream);
      local_ca0 = CONCAT44(local_ca0._4_4_,(uint)local_ca0 + 1);
    }
LAB_0010c16f:
    pfVar17 = ptVar19->facetlist;
    pfVar17[lVar10].polygonlist = (polygon *)0x0;
    pfVar17[lVar10].holelist = (double *)0x0;
    pfVar17[lVar10].numberofholes = 0;
    pfVar17[lVar10].numberofpolygons = 1;
    local_ca8 = pbVar7;
    local_c50 = lVar10;
    ppVar18 = (polygon *)operator_new__(0x10);
    pfVar17[lVar10].polygonlist = ppVar18;
    ppVar18->vertexlist = (int *)0x0;
    ppVar18->numberofvertices = (int)local_c70;
    piVar12 = (int *)operator_new__(local_c48);
    ppVar18->vertexlist = piVar12;
    ptVar19 = (tetgenio *)(ulong)*pbVar7;
    uVar25 = 0;
    do {
      if ((char)ptVar19 == '\0') goto LAB_0010c54d;
      lVar24 = strtol((char *)pbVar7,(char **)&local_ca8,0);
      lVar10 = local_c50;
      ptVar15 = local_c98;
      uVar22 = (uint)lVar24;
      ppVar18->vertexlist[uVar25] = uVar22;
      pbVar7 = local_ca8;
      if ((int)uVar21 < (int)uVar22) {
        uVar22 = uVar21;
      }
      while ((uVar21 = uVar22, in_RCX = (tetgenio *)(ulong)*pbVar7, (tetgenio *)0x2c < in_RCX ||
             ((0x100900000201U >> ((ulong)in_RCX & 0x3f) & 1) == 0))) {
        pbVar7 = pbVar7 + 1;
        uVar22 = uVar21;
      }
LAB_0010c22f:
      ptVar19 = in_RCX;
      if (0x2e < (byte)in_RCX) {
LAB_0010c242:
        uVar22 = (int)in_RCX - 0x3a;
        in_RCX = (tetgenio *)(ulong)uVar22;
        if (0xf5 < (byte)uVar22) goto LAB_0010c253;
        in_RCX = (tetgenio *)(ulong)pbVar7[1];
        pbVar7 = pbVar7 + 1;
        goto LAB_0010c22f;
      }
      if ((0x680000000001U >> ((ulong)in_RCX & 0x3f) & 1) != 0) goto LAB_0010c253;
      if (in_RCX != (tetgenio *)0x23) goto LAB_0010c242;
      *pbVar7 = 0;
      ptVar19 = (tetgenio *)0x0;
LAB_0010c253:
      uVar25 = uVar25 + 1;
      local_ca8 = pbVar7;
    } while (uVar25 != local_c88);
    local_c98->facetmarkerlist[local_c50] = 0;
    if (*pbVar7 != 0) {
      lVar24 = strtol((char *)pbVar7,(char **)&local_ca8,0);
      in_RCX = (tetgenio *)ptVar15->facetmarkerlist;
      (&in_RCX->firstnumber)[lVar10] = (int)lVar24;
    }
    lVar10 = lVar10 + 1;
    uVar25 = (long)(int)local_c80 + (long)ptVar15->numberoffacets;
    __stream = local_c90;
  } while (lVar10 < (long)uVar25);
  ptVar19 = local_c98;
  uVar22 = (uint)local_ca0;
LAB_0010be32:
  ptVar19->numberoffacets = (int)uVar25;
  local_c80 = 0;
  uVar25 = local_c60;
  goto LAB_0010b751;
LAB_0010c585:
  printf("Unexpected end of file on line %d in file %s\n",(ulong)uVar22,local_c38);
  goto LAB_0010c5a0;
LAB_0010c54d:
  __format = "Syntax error reading face on line %d in file %s\n";
  uVar8 = local_ca0 & 0xffffffff;
LAB_0010c55f:
  printf(__format,uVar8,local_c38);
  __stream = local_c90;
LAB_0010c5a0:
  fclose(__stream);
  return false;
}

Assistant:

bool tetgenio::load_medit(char* filebasename, int istetmesh)
{
  FILE *fp;
  tetgenio::facet *tmpflist, *f;
  tetgenio::polygon *p;
  char infilename[FILENAMESIZE];
  char buffer[INPUTLINESIZE];
  char *bufferp, *str;
  double *coord;
  int *tmpfmlist;
  int dimension = 0;
  int nverts = 0;
  int nfaces = 0;
  int ntets = 0;
  int line_count = 0;
  int corners = 0; // 3 (triangle) or 4 (quad).
  int *plist;
  int i, j;

  int smallestidx = 0;

  strncpy(infilename, filebasename, FILENAMESIZE - 1);
  infilename[FILENAMESIZE - 1] = '\0';
  if (infilename[0] == '\0') {
    printf("Error:  No filename.\n");
    return false;
  }
  if (strcmp(&infilename[strlen(infilename) - 5], ".mesh") != 0) {
    strcat(infilename, ".mesh");
  }
  
  if (!(fp = fopen(infilename, "r"))) {
    printf("Error:  Unable to open file %s\n", infilename);
    return false;
  }
  printf("Opening %s.\n", infilename);

  while ((bufferp = readline(buffer, fp, &line_count)) != NULL) {
    if (*bufferp == '#') continue;  // A comment line is skipped.
    if (dimension == 0) {
      // Find if it is the keyword "Dimension".
      str = strstr(bufferp, "Dimension");
      if (!str) str = strstr(bufferp, "dimension");
      if (!str) str = strstr(bufferp, "DIMENSION");
      if (str) {
        // Read the dimensions
        bufferp = findnextnumber(str); // Skip field "Dimension".
        if (*bufferp == '\0') {
          // Read a non-empty line.
          bufferp = readline(buffer, fp, &line_count);
        }
        dimension = (int) strtol(bufferp, &bufferp, 0);
        if (dimension != 2 && dimension != 3) {
          printf("Unknown dimension in file on line %d in file %s\n",
                 line_count, infilename);
          fclose(fp);
          return false;
        }
        mesh_dim = dimension;
      }
    }
    if (nverts == 0) {
      // Find if it is the keyword "Vertices".
      str = strstr(bufferp, "Vertices");
      if (!str) str = strstr(bufferp, "vertices");
      if (!str) str = strstr(bufferp, "VERTICES");
      if (str) {
        // Read the number of vertices.
        bufferp = findnextnumber(str); // Skip field "Vertices".
        if (*bufferp == '\0') {
          // Read a non-empty line.
          bufferp = readline(buffer, fp, &line_count);
        }
        nverts = (int) strtol(bufferp, &bufferp, 0);
        // Initialize the smallest index.
        smallestidx = nverts + 1;
        // Allocate memory for 'tetgenio'
        if (nverts > 0) {
          numberofpoints = nverts;
          pointlist = new REAL[nverts * 3];
        }
        // Read the follwoing node list.
        for (i = 0; i < nverts; i++) {
          bufferp = readline(buffer, fp, &line_count);
          if (bufferp == NULL) {
            printf("Unexpected end of file on line %d in file %s\n",
                   line_count, infilename);
            fclose(fp);
            return false;
          }
          // Read vertex coordinates
          coord = &pointlist[i * 3];
          for (j = 0; j < 3; j++) {
            if (*bufferp == '\0') {
              printf("Syntax error reading vertex coords on line");
              printf(" %d in file %s\n", line_count, infilename);
              fclose(fp);
              return false;
            }
            if ((j < 2) || (dimension == 3)) {
              coord[j] = (REAL) strtod(bufferp, &bufferp);
            } else {
              coord[j] = 0.0;
            }
            bufferp = findnextnumber(bufferp);
          }
        }
        continue;
      }
    }
    if (ntets == 0) {
      // Find if it is the keyword "Tetrahedra"
      corners = 0;
      str = strstr(bufferp, "Tetrahedra");
      if (!str) str = strstr(bufferp, "tetrahedra");
      if (!str) str = strstr(bufferp, "TETRAHEDRA");
      if (str) {
        corners = 4;
      }
      if (corners == 4) {
        // Read the number of tetrahedra
        bufferp = findnextnumber(str); // Skip field "Tetrahedra".
        if (*bufferp == '\0') {
          // Read a non-empty line.
          bufferp = readline(buffer, fp, &line_count);
        }
        ntets = strtol(bufferp, &bufferp, 0);
        if (ntets > 0) {
          // It is a tetrahedral mesh.
          numberoftetrahedra = ntets;
          numberofcorners = 4;
          numberoftetrahedronattributes = 1;
          tetrahedronlist = new int[ntets * 4];
          tetrahedronattributelist = new REAL[ntets];
        }
      } // if (corners == 4)
      // Read the list of tetrahedra.
      for (i = 0; i < numberoftetrahedra; i++) {
        plist = &(tetrahedronlist[i * 4]);
        bufferp = readline(buffer, fp, &line_count);
        if (bufferp == NULL) {
          printf("Unexpected end of file on line %d in file %s\n",
                 line_count, infilename);
          fclose(fp);
          return false;
        }
        // Read the vertices of the tet.
        for (j = 0; j < corners; j++) {
          if (*bufferp == '\0') {
            printf("Syntax error reading face on line %d in file %s\n",
                   line_count, infilename);
            fclose(fp);
            return false;
          }
          plist[j] = (int) strtol(bufferp, &bufferp, 0);
          // Remember the smallest index.
          if (plist[j] < smallestidx) smallestidx = plist[j];
          bufferp = findnextnumber(bufferp);
        }
        // Read the attribute of the tet if it exists.
        tetrahedronattributelist[i] = 0;
        if (*bufferp != '\0') {
          tetrahedronattributelist[i] = (REAL) strtol(bufferp, &bufferp, 0);
        }
      } // i
    } // Tetrahedra
    if (nfaces == 0) {
      // Find if it is the keyword "Triangles" or "Quadrilaterals".
      corners = 0;
      str = strstr(bufferp, "Triangles");
      if (!str) str = strstr(bufferp, "triangles");
      if (!str) str = strstr(bufferp, "TRIANGLES");
      if (str) {
        corners = 3;
      } else {
        str = strstr(bufferp, "Quadrilaterals");
        if (!str) str = strstr(bufferp, "quadrilaterals");
        if (!str) str = strstr(bufferp, "QUADRILATERALS");
        if (str) {
          corners = 4;
        }
      }
      if (corners == 3 || corners == 4) {
        // Read the number of triangles (or quadrilaterals).
        bufferp = findnextnumber(str); // Skip field "Triangles".
        if (*bufferp == '\0') {
          // Read a non-empty line.
          bufferp = readline(buffer, fp, &line_count);
        }
        nfaces = strtol(bufferp, &bufferp, 0);
        // Allocate memory for 'tetgenio'
        if (nfaces > 0) {
          if (!istetmesh) {
            // It is a PLC surface mesh.
            if (numberoffacets > 0) {
              // facetlist has already been allocated. Enlarge arrays.
              // This happens when the surface mesh contains mixed cells.
              tmpflist = new tetgenio::facet[numberoffacets + nfaces];
              tmpfmlist = new int[numberoffacets + nfaces];
              // Copy the data of old arrays into new arrays.
              for (i = 0; i < numberoffacets; i++) {
                f = &(tmpflist[i]);
                tetgenio::init(f);
                *f = facetlist[i];
                tmpfmlist[i] = facetmarkerlist[i];
              }
              // Release old arrays.
              delete [] facetlist;
              delete [] facetmarkerlist;
              // Remember the new arrays.
              facetlist = tmpflist;
              facetmarkerlist = tmpfmlist;
            } else {
              // This is the first time to allocate facetlist.
              facetlist = new tetgenio::facet[nfaces];
              facetmarkerlist = new int[nfaces];
            }
          } else {
            if (corners == 3) {
              // It is a surface mesh of a tetrahedral mesh.
              numberoftrifaces = nfaces;
              trifacelist = new int[nfaces * 3];
              trifacemarkerlist = new int[nfaces];
            }
          }
        } // if (nfaces > 0)
        // Read the following list of faces.
        if (!istetmesh) {
          for (i = numberoffacets; i < numberoffacets + nfaces; i++) {
            bufferp = readline(buffer, fp, &line_count);
            if (bufferp == NULL) {
              printf("Unexpected end of file on line %d in file %s\n",
                     line_count, infilename);
              fclose(fp);
              return false;
            }
            f = &facetlist[i];
            tetgenio::init(f);
            // In .mesh format, each facet has one polygon, no hole.
            f->numberofpolygons = 1;
            f->polygonlist = new tetgenio::polygon[1];
            p = &f->polygonlist[0];
            tetgenio::init(p);
            p->numberofvertices = corners;
            // Allocate memory for face vertices
            p->vertexlist = new int[p->numberofvertices];
            // Read the vertices of the face.
            for (j = 0; j < corners; j++) {
              if (*bufferp == '\0') {
                printf("Syntax error reading face on line %d in file %s\n",
                       line_count, infilename);
                fclose(fp);
                return false;
              }
              p->vertexlist[j] = (int) strtol(bufferp, &bufferp, 0);
              // Remember the smallest index.
              if (p->vertexlist[j] < smallestidx) {
                smallestidx = p->vertexlist[j];
              }
              bufferp = findnextnumber(bufferp);
            }
            // Read the marker of the face if it exists.
            facetmarkerlist[i] = 0;
            if (*bufferp != '\0') {
              facetmarkerlist[i] = (int) strtol(bufferp, &bufferp, 0);
            }
          }
          // Have read in a list of triangles/quads.
          numberoffacets += nfaces;
          nfaces = 0;
        } else {
          // It is a surface mesh of a tetrahedral mesh.
          if (corners == 3) {
            for (i = 0; i < numberoftrifaces; i++) {
              plist = &(trifacelist[i * 3]);
              bufferp = readline(buffer, fp, &line_count);
              if (bufferp == NULL) {
                printf("Unexpected end of file on line %d in file %s\n",
                       line_count, infilename);
                fclose(fp);
                return false;
              }
              // Read the vertices of the face.
              for (j = 0; j < corners; j++) {
                if (*bufferp == '\0') {
                  printf("Syntax error reading face on line %d in file %s\n",
                         line_count, infilename);
                  fclose(fp);
                  return false;
                }
                plist[j] = (int) strtol(bufferp, &bufferp, 0);
                // Remember the smallest index.
                if (plist[j] < smallestidx) {
                  smallestidx = plist[j];
                }
                bufferp = findnextnumber(bufferp);
              }
              // Read the marker of the face if it exists.
              trifacemarkerlist[i] = 0;
              if (*bufferp != '\0') {
                trifacemarkerlist[i] = (int) strtol(bufferp, &bufferp, 0);
              }
            } // i
          } // if (corners == 3)
        } // if (b->refine)
      } // if (corners == 3 || corners == 4)
    }
  }

  // Close file
  fclose(fp);

  // Decide the firstnumber of the index.
  if (smallestidx == 0) {
    firstnumber = 0;  
  } else if (smallestidx == 1) {
    firstnumber = 1;
  } else {
    printf("A wrong smallest index (%d) was detected in file %s\n",
           smallestidx, infilename);
    return false;
  }

  return true;
}